

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx512::DiscMiMBIntersectorK<4,_16,_true>::intersect
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  float fVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  byte bVar55;
  uint uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined4 uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_410;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  float local_390 [4];
  float local_380 [4];
  float local_370 [8];
  undefined1 local_350 [16];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar62 [16];
  undefined1 auVar76 [64];
  undefined1 auVar91 [64];
  
  pSVar7 = context->scene;
  pGVar8 = (pSVar7->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar8->time_range).lower;
  uVar49 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar28 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar1) / ((pGVar8->time_range).upper - fVar1));
  auVar62 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),9);
  auVar62 = vminss_avx(auVar62,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar58 = vmaxss_avx(ZEXT816(0) << 0x20,auVar62);
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar50 = (long)(int)auVar58._0_4_ * 0x38;
  lVar10 = *(long *)(lVar9 + lVar50);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar50);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar49);
  uVar51 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar69 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar51);
  uVar52 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar52);
  uVar53 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar70 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar53);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar50);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar50);
  auVar72 = *(undefined1 (*) [16])(lVar10 + uVar49 * lVar9);
  auVar5 = *(undefined1 (*) [16])(lVar10 + uVar51 * lVar9);
  auVar61 = *(undefined1 (*) [16])(lVar10 + uVar52 * lVar9);
  auVar6 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar53);
  auVar57 = vpbroadcastd_avx512vl();
  local_350 = vpbroadcastd_avx512vl();
  fVar28 = fVar28 - auVar58._0_4_;
  auVar58 = vunpcklps_avx(auVar62,auVar59);
  auVar62 = vunpckhps_avx(auVar62,auVar59);
  auVar59 = vunpcklps_avx(auVar69,auVar70);
  auVar69 = vunpckhps_avx(auVar69,auVar70);
  auVar60 = vunpcklps_avx(auVar58,auVar59);
  auVar59 = vunpckhps_avx(auVar58,auVar59);
  auVar58 = vunpcklps_avx(auVar62,auVar69);
  auVar67 = vunpcklps_avx(auVar72,auVar61);
  auVar70 = vunpckhps_avx(auVar72,auVar61);
  auVar61 = vunpcklps_avx(auVar5,auVar6);
  auVar72 = vunpckhps_avx(auVar5,auVar6);
  auVar6 = vunpcklps_avx(auVar67,auVar61);
  auVar5 = vunpckhps_avx(auVar67,auVar61);
  auVar61 = vunpcklps_avx(auVar70,auVar72);
  fVar1 = 1.0 - fVar28;
  auVar78._4_4_ = fVar1;
  auVar78._0_4_ = fVar1;
  auVar78._8_4_ = fVar1;
  auVar78._12_4_ = fVar1;
  auVar74._0_4_ = fVar28 * auVar6._0_4_;
  auVar74._4_4_ = fVar28 * auVar6._4_4_;
  auVar74._8_4_ = fVar28 * auVar6._8_4_;
  auVar74._12_4_ = fVar28 * auVar6._12_4_;
  auVar86._0_4_ = fVar28 * auVar5._0_4_;
  auVar86._4_4_ = fVar28 * auVar5._4_4_;
  auVar86._8_4_ = fVar28 * auVar5._8_4_;
  auVar86._12_4_ = fVar28 * auVar5._12_4_;
  auVar89._0_4_ = fVar28 * auVar61._0_4_;
  auVar89._4_4_ = fVar28 * auVar61._4_4_;
  auVar89._8_4_ = fVar28 * auVar61._8_4_;
  auVar89._12_4_ = fVar28 * auVar61._12_4_;
  auVar5 = vfmadd231ps_fma(auVar74,auVar78,auVar60);
  auVar61 = vfmadd231ps_fma(auVar86,auVar78,auVar59);
  auVar6 = vfmadd231ps_fma(auVar89,auVar78,auVar58);
  fVar1 = *(float *)(ray + k * 4 + 0x100);
  auVar67._4_4_ = fVar1;
  auVar67._0_4_ = fVar1;
  auVar67._8_4_ = fVar1;
  auVar67._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x140);
  auVar68._4_4_ = fVar2;
  auVar68._0_4_ = fVar2;
  auVar68._8_4_ = fVar2;
  auVar68._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x180);
  auVar59 = vfmadd231ps_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar68,auVar68);
  auVar59 = vfmadd231ps_fma(auVar59,auVar67,auVar67);
  uVar81 = auVar59._0_4_;
  auVar60._4_4_ = uVar81;
  auVar60._0_4_ = uVar81;
  auVar60._8_4_ = uVar81;
  auVar60._12_4_ = uVar81;
  auVar58 = vrcp14ps_avx512vl(auVar60);
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = 0x3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59 = vfnmadd213ps_avx512vl(auVar60,auVar58,auVar59);
  auVar59 = vfmadd132ps_fma(auVar59,auVar58,auVar58);
  uVar81 = *(undefined4 *)(ray + k * 4);
  auVar58._4_4_ = uVar81;
  auVar58._0_4_ = uVar81;
  auVar58._8_4_ = uVar81;
  auVar58._12_4_ = uVar81;
  auVar58 = vsubps_avx512vl(auVar5,auVar58);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar5._4_4_ = uVar81;
  auVar5._0_4_ = uVar81;
  auVar5._8_4_ = uVar81;
  auVar5._12_4_ = uVar81;
  auVar60 = vsubps_avx512vl(auVar61,auVar5);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar61._4_4_ = uVar81;
  auVar61._0_4_ = uVar81;
  auVar61._8_4_ = uVar81;
  auVar61._12_4_ = uVar81;
  auVar61 = vsubps_avx512vl(auVar6,auVar61);
  fVar82 = auVar61._0_4_;
  auVar87._0_4_ = fVar82 * fVar3;
  fVar83 = auVar61._4_4_;
  auVar87._4_4_ = fVar83 * fVar3;
  fVar84 = auVar61._8_4_;
  auVar87._8_4_ = fVar84 * fVar3;
  fVar85 = auVar61._12_4_;
  auVar87._12_4_ = fVar85 * fVar3;
  auVar5 = vfmadd231ps_fma(auVar87,auVar60,auVar68);
  auVar5 = vfmadd231ps_fma(auVar5,auVar58,auVar67);
  local_3a0._0_4_ = auVar5._0_4_ * auVar59._0_4_;
  local_3a0._4_4_ = auVar5._4_4_ * auVar59._4_4_;
  local_3a0._8_4_ = auVar5._8_4_ * auVar59._8_4_;
  local_3a0._12_4_ = auVar5._12_4_ * auVar59._12_4_;
  auVar88 = ZEXT1664(local_3a0);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar90._4_4_ = uVar81;
  auVar90._0_4_ = uVar81;
  auVar90._8_4_ = uVar81;
  auVar90._12_4_ = uVar81;
  auVar91 = ZEXT1664(auVar90);
  uVar29 = vcmpps_avx512vl(local_3a0,auVar90,2);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar6._4_4_ = uVar81;
  auVar6._0_4_ = uVar81;
  auVar6._8_4_ = uVar81;
  auVar6._12_4_ = uVar81;
  uVar30 = vcmpps_avx512vl(local_3a0,auVar6,0xd);
  uVar31 = vpcmpgtd_avx512vl(auVar57,_DAT_01f7fcf0);
  bVar55 = (byte)uVar29 & (byte)uVar30 & 0xf & (byte)uVar31;
  if (bVar55 != 0) {
    auVar62 = vunpckhps_avx(auVar62,auVar69);
    auVar69 = vunpckhps_avx(auVar70,auVar72);
    auVar70._0_4_ = fVar28 * auVar69._0_4_;
    auVar70._4_4_ = fVar28 * auVar69._4_4_;
    auVar70._8_4_ = fVar28 * auVar69._8_4_;
    auVar70._12_4_ = fVar28 * auVar69._12_4_;
    auVar70 = vfmadd231ps_fma(auVar70,auVar78,auVar62);
    auVar62._0_4_ = local_3a0._0_4_ * fVar1;
    auVar62._4_4_ = local_3a0._4_4_ * fVar1;
    auVar62._8_4_ = local_3a0._8_4_ * fVar1;
    auVar62._12_4_ = local_3a0._12_4_ * fVar1;
    auVar72._0_4_ = local_3a0._0_4_ * fVar2;
    auVar72._4_4_ = local_3a0._4_4_ * fVar2;
    auVar72._8_4_ = local_3a0._8_4_ * fVar2;
    auVar72._12_4_ = local_3a0._12_4_ * fVar2;
    auVar57._0_4_ = local_3a0._0_4_ * fVar3;
    auVar57._4_4_ = local_3a0._4_4_ * fVar3;
    auVar57._8_4_ = local_3a0._8_4_ * fVar3;
    auVar57._12_4_ = local_3a0._12_4_ * fVar3;
    auVar62 = vsubps_avx(auVar58,auVar62);
    auVar69 = vsubps_avx(auVar60,auVar72);
    auVar59 = vsubps_avx(auVar61,auVar57);
    auVar73._0_4_ = auVar59._0_4_ * auVar59._0_4_;
    auVar73._4_4_ = auVar59._4_4_ * auVar59._4_4_;
    auVar73._8_4_ = auVar59._8_4_ * auVar59._8_4_;
    auVar73._12_4_ = auVar59._12_4_ * auVar59._12_4_;
    auVar69 = vfmadd231ps_fma(auVar73,auVar69,auVar69);
    auVar62 = vfmadd231ps_fma(auVar69,auVar62,auVar62);
    auVar69._0_4_ = auVar70._0_4_ * auVar70._0_4_;
    auVar69._4_4_ = auVar70._4_4_ * auVar70._4_4_;
    auVar69._8_4_ = auVar70._8_4_ * auVar70._8_4_;
    auVar69._12_4_ = auVar70._12_4_ * auVar70._12_4_;
    uVar29 = vcmpps_avx512vl(auVar62,auVar69,2);
    bVar55 = (byte)uVar29 & bVar55;
    if (bVar55 != 0) {
      auVar71._0_4_ = fVar82 * fVar82;
      auVar71._4_4_ = fVar83 * fVar83;
      auVar71._8_4_ = fVar84 * fVar84;
      auVar71._12_4_ = fVar85 * fVar85;
      auVar62 = vfmadd213ps_fma(auVar60,auVar60,auVar71);
      auVar62 = vfmadd213ps_fma(auVar58,auVar58,auVar62);
      uVar29 = vcmpps_avx512vl(auVar62,auVar69,6);
      bVar55 = bVar55 & (byte)uVar29;
      uVar56 = (uint)bVar55;
      if (bVar55 != 0) {
        local_3c0 = ZEXT432(0) << 0x20;
        local_390[0] = -fVar1;
        local_390[1] = -fVar1;
        local_390[2] = -fVar1;
        local_390[3] = -fVar1;
        local_380[0] = -fVar2;
        local_380[1] = -fVar2;
        local_380[2] = -fVar2;
        local_380[3] = -fVar2;
        local_370[0] = -fVar3;
        local_370[1] = -fVar3;
        local_370[2] = -fVar3;
        local_370[3] = -fVar3;
        auVar75._8_4_ = 0x7f800000;
        auVar75._0_8_ = 0x7f8000007f800000;
        auVar75._12_4_ = 0x7f800000;
        auVar76 = ZEXT1664(auVar75);
        auVar62 = vblendmps_avx512vl(auVar75,local_3a0);
        auVar63._0_4_ = (uint)(bVar55 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)-fVar3
        ;
        bVar13 = (bool)(bVar55 >> 1 & 1);
        auVar63._4_4_ = (uint)bVar13 * auVar62._4_4_ | (uint)!bVar13 * (int)-fVar3;
        bVar13 = (bool)(bVar55 >> 2 & 1);
        auVar63._8_4_ = (uint)bVar13 * auVar62._8_4_ | (uint)!bVar13 * (int)-fVar3;
        auVar63._12_4_ =
             (uint)(bVar55 >> 3) * auVar62._12_4_ | (uint)!(bool)(bVar55 >> 3) * (int)-fVar3;
        auVar62 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar62 = vminps_avx(auVar62,auVar63);
        auVar69 = vshufpd_avx(auVar62,auVar62,1);
        auVar62 = vminps_avx(auVar69,auVar62);
        uVar29 = vcmpps_avx512vl(auVar63,auVar62,0);
        uVar48 = uVar56;
        if (((byte)uVar29 & bVar55) != 0) {
          uVar48 = (uint)((byte)uVar29 & bVar55);
        }
        uVar47 = 0;
        for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x80000000) {
          uVar47 = uVar47 + 1;
        }
        auVar77 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar79 = vpcmpeqd_avx2(ZEXT1632(auVar78),ZEXT1632(auVar78));
        auVar80 = ZEXT3264(auVar79);
        do {
          local_410.valid = (int *)local_340;
          uVar54 = uVar47 & 0xff;
          uVar48 = *(uint *)(local_350 + (ulong)uVar54 * 4);
          pGVar8 = (pSVar7->geometries).items[uVar48].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
            bVar55 = ~(byte)(1 << (uVar47 & 0x1f)) & (byte)uVar56;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar49 = (ulong)(uVar54 << 2);
              uVar81 = *(undefined4 *)(local_3c0 + uVar49);
              uVar4 = *(undefined4 *)(local_3c0 + uVar49 + 0x10);
              *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_3a0 + uVar49);
              *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)((long)local_390 + uVar49);
              *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_380 + uVar49);
              *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_370 + uVar49);
              *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar81;
              *(undefined4 *)(ray + k * 4 + 0x400) = uVar4;
              *(undefined4 *)(ray + k * 4 + 0x440) =
                   *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar49);
              *(uint *)(ray + k * 4 + 0x480) = uVar48;
              *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              return;
            }
            uVar49 = (ulong)(uVar54 * 4);
            local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3c0 + uVar49)));
            local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3c0 + uVar49 + 0x10)));
            auVar65 = vpbroadcastd_avx512f();
            local_180 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)&(Disc->primIDs).field_0 + uVar49)));
            auVar66 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_390 + uVar49)));
            local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_380 + uVar49)));
            local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_370 + uVar49)));
            local_2c0[0] = (RTCHitN)auVar66[0];
            local_2c0[1] = (RTCHitN)auVar66[1];
            local_2c0[2] = (RTCHitN)auVar66[2];
            local_2c0[3] = (RTCHitN)auVar66[3];
            local_2c0[4] = (RTCHitN)auVar66[4];
            local_2c0[5] = (RTCHitN)auVar66[5];
            local_2c0[6] = (RTCHitN)auVar66[6];
            local_2c0[7] = (RTCHitN)auVar66[7];
            local_2c0[8] = (RTCHitN)auVar66[8];
            local_2c0[9] = (RTCHitN)auVar66[9];
            local_2c0[10] = (RTCHitN)auVar66[10];
            local_2c0[0xb] = (RTCHitN)auVar66[0xb];
            local_2c0[0xc] = (RTCHitN)auVar66[0xc];
            local_2c0[0xd] = (RTCHitN)auVar66[0xd];
            local_2c0[0xe] = (RTCHitN)auVar66[0xe];
            local_2c0[0xf] = (RTCHitN)auVar66[0xf];
            local_2c0[0x10] = (RTCHitN)auVar66[0x10];
            local_2c0[0x11] = (RTCHitN)auVar66[0x11];
            local_2c0[0x12] = (RTCHitN)auVar66[0x12];
            local_2c0[0x13] = (RTCHitN)auVar66[0x13];
            local_2c0[0x14] = (RTCHitN)auVar66[0x14];
            local_2c0[0x15] = (RTCHitN)auVar66[0x15];
            local_2c0[0x16] = (RTCHitN)auVar66[0x16];
            local_2c0[0x17] = (RTCHitN)auVar66[0x17];
            local_2c0[0x18] = (RTCHitN)auVar66[0x18];
            local_2c0[0x19] = (RTCHitN)auVar66[0x19];
            local_2c0[0x1a] = (RTCHitN)auVar66[0x1a];
            local_2c0[0x1b] = (RTCHitN)auVar66[0x1b];
            local_2c0[0x1c] = (RTCHitN)auVar66[0x1c];
            local_2c0[0x1d] = (RTCHitN)auVar66[0x1d];
            local_2c0[0x1e] = (RTCHitN)auVar66[0x1e];
            local_2c0[0x1f] = (RTCHitN)auVar66[0x1f];
            local_2c0[0x20] = (RTCHitN)auVar66[0x20];
            local_2c0[0x21] = (RTCHitN)auVar66[0x21];
            local_2c0[0x22] = (RTCHitN)auVar66[0x22];
            local_2c0[0x23] = (RTCHitN)auVar66[0x23];
            local_2c0[0x24] = (RTCHitN)auVar66[0x24];
            local_2c0[0x25] = (RTCHitN)auVar66[0x25];
            local_2c0[0x26] = (RTCHitN)auVar66[0x26];
            local_2c0[0x27] = (RTCHitN)auVar66[0x27];
            local_2c0[0x28] = (RTCHitN)auVar66[0x28];
            local_2c0[0x29] = (RTCHitN)auVar66[0x29];
            local_2c0[0x2a] = (RTCHitN)auVar66[0x2a];
            local_2c0[0x2b] = (RTCHitN)auVar66[0x2b];
            local_2c0[0x2c] = (RTCHitN)auVar66[0x2c];
            local_2c0[0x2d] = (RTCHitN)auVar66[0x2d];
            local_2c0[0x2e] = (RTCHitN)auVar66[0x2e];
            local_2c0[0x2f] = (RTCHitN)auVar66[0x2f];
            local_2c0[0x30] = (RTCHitN)auVar66[0x30];
            local_2c0[0x31] = (RTCHitN)auVar66[0x31];
            local_2c0[0x32] = (RTCHitN)auVar66[0x32];
            local_2c0[0x33] = (RTCHitN)auVar66[0x33];
            local_2c0[0x34] = (RTCHitN)auVar66[0x34];
            local_2c0[0x35] = (RTCHitN)auVar66[0x35];
            local_2c0[0x36] = (RTCHitN)auVar66[0x36];
            local_2c0[0x37] = (RTCHitN)auVar66[0x37];
            local_2c0[0x38] = (RTCHitN)auVar66[0x38];
            local_2c0[0x39] = (RTCHitN)auVar66[0x39];
            local_2c0[0x3a] = (RTCHitN)auVar66[0x3a];
            local_2c0[0x3b] = (RTCHitN)auVar66[0x3b];
            local_2c0[0x3c] = (RTCHitN)auVar66[0x3c];
            local_2c0[0x3d] = (RTCHitN)auVar66[0x3d];
            local_2c0[0x3e] = (RTCHitN)auVar66[0x3e];
            local_2c0[0x3f] = (RTCHitN)auVar66[0x3f];
            local_140 = vmovdqa64_avx512f(auVar65);
            local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
            local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
            local_410.hit = local_2c0;
            *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_3a0 + uVar49);
            local_340 = vmovdqa64_avx512f(auVar77);
            local_410.geometryUserPtr = pGVar8->userPtr;
            local_410.context = context->user;
            local_410.N = 0x10;
            auVar65 = vmovdqa64_avx512f(auVar77);
            local_3d0 = auVar88._0_16_;
            local_3e0 = auVar91._0_16_;
            local_300 = vmovdqa64_avx512f(auVar77);
            local_410.ray = (RTCRayN *)ray;
            if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar79 = ZEXT1632(auVar80._0_16_);
              (*pGVar8->intersectionFilterN)(&local_410);
              auVar79 = vpcmpeqd_avx2(auVar79,auVar79);
              auVar80 = ZEXT3264(auVar79);
              auVar77 = vmovdqa64_avx512f(local_300);
              auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar91 = ZEXT1664(local_3e0);
              auVar88 = ZEXT1664(local_3d0);
              auVar65 = vmovdqa64_avx512f(local_340);
            }
            uVar29 = vptestmd_avx512f(auVar65,auVar65);
            if ((short)uVar29 == 0) {
LAB_01b402fb:
              *(int *)(ray + k * 4 + 0x200) = auVar91._0_4_;
            }
            else {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                auVar79 = ZEXT1632(auVar80._0_16_);
                (*p_Var12)(&local_410);
                auVar79 = vpcmpeqd_avx2(auVar79,auVar79);
                auVar80 = ZEXT3264(auVar79);
                auVar77 = vmovdqa64_avx512f(local_300);
                auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar91 = ZEXT1664(local_3e0);
                auVar88 = ZEXT1664(local_3d0);
                auVar65 = vmovdqa64_avx512f(local_340);
              }
              uVar49 = vptestmd_avx512f(auVar65,auVar65);
              if ((short)uVar49 == 0) goto LAB_01b402fb;
              iVar32 = *(int *)(local_410.hit + 4);
              iVar33 = *(int *)(local_410.hit + 8);
              iVar34 = *(int *)(local_410.hit + 0xc);
              iVar35 = *(int *)(local_410.hit + 0x10);
              iVar36 = *(int *)(local_410.hit + 0x14);
              iVar37 = *(int *)(local_410.hit + 0x18);
              iVar38 = *(int *)(local_410.hit + 0x1c);
              iVar39 = *(int *)(local_410.hit + 0x20);
              iVar40 = *(int *)(local_410.hit + 0x24);
              iVar41 = *(int *)(local_410.hit + 0x28);
              iVar42 = *(int *)(local_410.hit + 0x2c);
              iVar43 = *(int *)(local_410.hit + 0x30);
              iVar44 = *(int *)(local_410.hit + 0x34);
              iVar45 = *(int *)(local_410.hit + 0x38);
              iVar46 = *(int *)(local_410.hit + 0x3c);
              bVar55 = (byte)uVar49;
              bVar13 = (bool)((byte)(uVar49 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar49 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar49 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar49 >> 7) & 1);
              bVar20 = (byte)(uVar49 >> 8);
              bVar21 = (bool)((byte)(uVar49 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar49 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar49 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar49 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar49 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar49 >> 0xe) & 1);
              bVar27 = SUB81(uVar49 >> 0xf,0);
              *(uint *)(local_410.ray + 0x300) =
                   (uint)(bVar55 & 1) * *(int *)local_410.hit |
                   (uint)!(bool)(bVar55 & 1) * *(int *)(local_410.ray + 0x300);
              *(uint *)(local_410.ray + 0x304) =
                   (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_410.ray + 0x304);
              *(uint *)(local_410.ray + 0x308) =
                   (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_410.ray + 0x308);
              *(uint *)(local_410.ray + 0x30c) =
                   (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_410.ray + 0x30c);
              *(uint *)(local_410.ray + 0x310) =
                   (uint)bVar16 * iVar35 | (uint)!bVar16 * *(int *)(local_410.ray + 0x310);
              *(uint *)(local_410.ray + 0x314) =
                   (uint)bVar17 * iVar36 | (uint)!bVar17 * *(int *)(local_410.ray + 0x314);
              *(uint *)(local_410.ray + 0x318) =
                   (uint)bVar18 * iVar37 | (uint)!bVar18 * *(int *)(local_410.ray + 0x318);
              *(uint *)(local_410.ray + 0x31c) =
                   (uint)bVar19 * iVar38 | (uint)!bVar19 * *(int *)(local_410.ray + 0x31c);
              *(uint *)(local_410.ray + 800) =
                   (uint)(bVar20 & 1) * iVar39 |
                   (uint)!(bool)(bVar20 & 1) * *(int *)(local_410.ray + 800);
              *(uint *)(local_410.ray + 0x324) =
                   (uint)bVar21 * iVar40 | (uint)!bVar21 * *(int *)(local_410.ray + 0x324);
              *(uint *)(local_410.ray + 0x328) =
                   (uint)bVar22 * iVar41 | (uint)!bVar22 * *(int *)(local_410.ray + 0x328);
              *(uint *)(local_410.ray + 0x32c) =
                   (uint)bVar23 * iVar42 | (uint)!bVar23 * *(int *)(local_410.ray + 0x32c);
              *(uint *)(local_410.ray + 0x330) =
                   (uint)bVar24 * iVar43 | (uint)!bVar24 * *(int *)(local_410.ray + 0x330);
              *(uint *)(local_410.ray + 0x334) =
                   (uint)bVar25 * iVar44 | (uint)!bVar25 * *(int *)(local_410.ray + 0x334);
              *(uint *)(local_410.ray + 0x338) =
                   (uint)bVar26 * iVar45 | (uint)!bVar26 * *(int *)(local_410.ray + 0x338);
              *(uint *)(local_410.ray + 0x33c) =
                   (uint)bVar27 * iVar46 | (uint)!bVar27 * *(int *)(local_410.ray + 0x33c);
              iVar32 = *(int *)(local_410.hit + 0x44);
              iVar33 = *(int *)(local_410.hit + 0x48);
              iVar34 = *(int *)(local_410.hit + 0x4c);
              iVar35 = *(int *)(local_410.hit + 0x50);
              iVar36 = *(int *)(local_410.hit + 0x54);
              iVar37 = *(int *)(local_410.hit + 0x58);
              iVar38 = *(int *)(local_410.hit + 0x5c);
              iVar39 = *(int *)(local_410.hit + 0x60);
              iVar40 = *(int *)(local_410.hit + 100);
              iVar41 = *(int *)(local_410.hit + 0x68);
              iVar42 = *(int *)(local_410.hit + 0x6c);
              iVar43 = *(int *)(local_410.hit + 0x70);
              iVar44 = *(int *)(local_410.hit + 0x74);
              iVar45 = *(int *)(local_410.hit + 0x78);
              iVar46 = *(int *)(local_410.hit + 0x7c);
              bVar13 = (bool)((byte)(uVar49 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar49 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar49 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar49 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar49 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar49 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar49 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar49 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar49 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar49 >> 0xe) & 1);
              bVar27 = SUB81(uVar49 >> 0xf,0);
              *(uint *)(local_410.ray + 0x340) =
                   (uint)(bVar55 & 1) * *(int *)(local_410.hit + 0x40) |
                   (uint)!(bool)(bVar55 & 1) * *(int *)(local_410.ray + 0x340);
              *(uint *)(local_410.ray + 0x344) =
                   (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_410.ray + 0x344);
              *(uint *)(local_410.ray + 0x348) =
                   (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_410.ray + 0x348);
              *(uint *)(local_410.ray + 0x34c) =
                   (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_410.ray + 0x34c);
              *(uint *)(local_410.ray + 0x350) =
                   (uint)bVar16 * iVar35 | (uint)!bVar16 * *(int *)(local_410.ray + 0x350);
              *(uint *)(local_410.ray + 0x354) =
                   (uint)bVar17 * iVar36 | (uint)!bVar17 * *(int *)(local_410.ray + 0x354);
              *(uint *)(local_410.ray + 0x358) =
                   (uint)bVar18 * iVar37 | (uint)!bVar18 * *(int *)(local_410.ray + 0x358);
              *(uint *)(local_410.ray + 0x35c) =
                   (uint)bVar19 * iVar38 | (uint)!bVar19 * *(int *)(local_410.ray + 0x35c);
              *(uint *)(local_410.ray + 0x360) =
                   (uint)(bVar20 & 1) * iVar39 |
                   (uint)!(bool)(bVar20 & 1) * *(int *)(local_410.ray + 0x360);
              *(uint *)(local_410.ray + 0x364) =
                   (uint)bVar21 * iVar40 | (uint)!bVar21 * *(int *)(local_410.ray + 0x364);
              *(uint *)(local_410.ray + 0x368) =
                   (uint)bVar22 * iVar41 | (uint)!bVar22 * *(int *)(local_410.ray + 0x368);
              *(uint *)(local_410.ray + 0x36c) =
                   (uint)bVar23 * iVar42 | (uint)!bVar23 * *(int *)(local_410.ray + 0x36c);
              *(uint *)(local_410.ray + 0x370) =
                   (uint)bVar24 * iVar43 | (uint)!bVar24 * *(int *)(local_410.ray + 0x370);
              *(uint *)(local_410.ray + 0x374) =
                   (uint)bVar25 * iVar44 | (uint)!bVar25 * *(int *)(local_410.ray + 0x374);
              *(uint *)(local_410.ray + 0x378) =
                   (uint)bVar26 * iVar45 | (uint)!bVar26 * *(int *)(local_410.ray + 0x378);
              *(uint *)(local_410.ray + 0x37c) =
                   (uint)bVar27 * iVar46 | (uint)!bVar27 * *(int *)(local_410.ray + 0x37c);
              iVar32 = *(int *)(local_410.hit + 0x84);
              iVar33 = *(int *)(local_410.hit + 0x88);
              iVar34 = *(int *)(local_410.hit + 0x8c);
              iVar35 = *(int *)(local_410.hit + 0x90);
              iVar36 = *(int *)(local_410.hit + 0x94);
              iVar37 = *(int *)(local_410.hit + 0x98);
              iVar38 = *(int *)(local_410.hit + 0x9c);
              iVar39 = *(int *)(local_410.hit + 0xa0);
              iVar40 = *(int *)(local_410.hit + 0xa4);
              iVar41 = *(int *)(local_410.hit + 0xa8);
              iVar42 = *(int *)(local_410.hit + 0xac);
              iVar43 = *(int *)(local_410.hit + 0xb0);
              iVar44 = *(int *)(local_410.hit + 0xb4);
              iVar45 = *(int *)(local_410.hit + 0xb8);
              iVar46 = *(int *)(local_410.hit + 0xbc);
              bVar13 = (bool)((byte)(uVar49 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar49 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar49 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar49 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar49 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar49 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar49 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar49 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar49 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar49 >> 0xe) & 1);
              bVar27 = SUB81(uVar49 >> 0xf,0);
              *(uint *)(local_410.ray + 0x380) =
                   (uint)(bVar55 & 1) * *(int *)(local_410.hit + 0x80) |
                   (uint)!(bool)(bVar55 & 1) * *(int *)(local_410.ray + 0x380);
              *(uint *)(local_410.ray + 900) =
                   (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_410.ray + 900);
              *(uint *)(local_410.ray + 0x388) =
                   (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_410.ray + 0x388);
              *(uint *)(local_410.ray + 0x38c) =
                   (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_410.ray + 0x38c);
              *(uint *)(local_410.ray + 0x390) =
                   (uint)bVar16 * iVar35 | (uint)!bVar16 * *(int *)(local_410.ray + 0x390);
              *(uint *)(local_410.ray + 0x394) =
                   (uint)bVar17 * iVar36 | (uint)!bVar17 * *(int *)(local_410.ray + 0x394);
              *(uint *)(local_410.ray + 0x398) =
                   (uint)bVar18 * iVar37 | (uint)!bVar18 * *(int *)(local_410.ray + 0x398);
              *(uint *)(local_410.ray + 0x39c) =
                   (uint)bVar19 * iVar38 | (uint)!bVar19 * *(int *)(local_410.ray + 0x39c);
              *(uint *)(local_410.ray + 0x3a0) =
                   (uint)(bVar20 & 1) * iVar39 |
                   (uint)!(bool)(bVar20 & 1) * *(int *)(local_410.ray + 0x3a0);
              *(uint *)(local_410.ray + 0x3a4) =
                   (uint)bVar21 * iVar40 | (uint)!bVar21 * *(int *)(local_410.ray + 0x3a4);
              *(uint *)(local_410.ray + 0x3a8) =
                   (uint)bVar22 * iVar41 | (uint)!bVar22 * *(int *)(local_410.ray + 0x3a8);
              *(uint *)(local_410.ray + 0x3ac) =
                   (uint)bVar23 * iVar42 | (uint)!bVar23 * *(int *)(local_410.ray + 0x3ac);
              *(uint *)(local_410.ray + 0x3b0) =
                   (uint)bVar24 * iVar43 | (uint)!bVar24 * *(int *)(local_410.ray + 0x3b0);
              *(uint *)(local_410.ray + 0x3b4) =
                   (uint)bVar25 * iVar44 | (uint)!bVar25 * *(int *)(local_410.ray + 0x3b4);
              *(uint *)(local_410.ray + 0x3b8) =
                   (uint)bVar26 * iVar45 | (uint)!bVar26 * *(int *)(local_410.ray + 0x3b8);
              *(uint *)(local_410.ray + 0x3bc) =
                   (uint)bVar27 * iVar46 | (uint)!bVar27 * *(int *)(local_410.ray + 0x3bc);
              iVar32 = *(int *)(local_410.hit + 0xc4);
              iVar33 = *(int *)(local_410.hit + 200);
              iVar34 = *(int *)(local_410.hit + 0xcc);
              iVar35 = *(int *)(local_410.hit + 0xd0);
              iVar36 = *(int *)(local_410.hit + 0xd4);
              iVar37 = *(int *)(local_410.hit + 0xd8);
              iVar38 = *(int *)(local_410.hit + 0xdc);
              iVar39 = *(int *)(local_410.hit + 0xe0);
              iVar40 = *(int *)(local_410.hit + 0xe4);
              iVar41 = *(int *)(local_410.hit + 0xe8);
              iVar42 = *(int *)(local_410.hit + 0xec);
              iVar43 = *(int *)(local_410.hit + 0xf0);
              iVar44 = *(int *)(local_410.hit + 0xf4);
              iVar45 = *(int *)(local_410.hit + 0xf8);
              iVar46 = *(int *)(local_410.hit + 0xfc);
              bVar13 = (bool)((byte)(uVar49 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar49 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar49 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar49 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar49 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar49 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar49 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar49 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar49 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar49 >> 0xe) & 1);
              bVar27 = SUB81(uVar49 >> 0xf,0);
              *(uint *)(local_410.ray + 0x3c0) =
                   (uint)(bVar55 & 1) * *(int *)(local_410.hit + 0xc0) |
                   (uint)!(bool)(bVar55 & 1) * *(int *)(local_410.ray + 0x3c0);
              *(uint *)(local_410.ray + 0x3c4) =
                   (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_410.ray + 0x3c4);
              *(uint *)(local_410.ray + 0x3c8) =
                   (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_410.ray + 0x3c8);
              *(uint *)(local_410.ray + 0x3cc) =
                   (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_410.ray + 0x3cc);
              *(uint *)(local_410.ray + 0x3d0) =
                   (uint)bVar16 * iVar35 | (uint)!bVar16 * *(int *)(local_410.ray + 0x3d0);
              *(uint *)(local_410.ray + 0x3d4) =
                   (uint)bVar17 * iVar36 | (uint)!bVar17 * *(int *)(local_410.ray + 0x3d4);
              *(uint *)(local_410.ray + 0x3d8) =
                   (uint)bVar18 * iVar37 | (uint)!bVar18 * *(int *)(local_410.ray + 0x3d8);
              *(uint *)(local_410.ray + 0x3dc) =
                   (uint)bVar19 * iVar38 | (uint)!bVar19 * *(int *)(local_410.ray + 0x3dc);
              *(uint *)(local_410.ray + 0x3e0) =
                   (uint)(bVar20 & 1) * iVar39 |
                   (uint)!(bool)(bVar20 & 1) * *(int *)(local_410.ray + 0x3e0);
              *(uint *)(local_410.ray + 0x3e4) =
                   (uint)bVar21 * iVar40 | (uint)!bVar21 * *(int *)(local_410.ray + 0x3e4);
              *(uint *)(local_410.ray + 1000) =
                   (uint)bVar22 * iVar41 | (uint)!bVar22 * *(int *)(local_410.ray + 1000);
              *(uint *)(local_410.ray + 0x3ec) =
                   (uint)bVar23 * iVar42 | (uint)!bVar23 * *(int *)(local_410.ray + 0x3ec);
              *(uint *)(local_410.ray + 0x3f0) =
                   (uint)bVar24 * iVar43 | (uint)!bVar24 * *(int *)(local_410.ray + 0x3f0);
              *(uint *)(local_410.ray + 0x3f4) =
                   (uint)bVar25 * iVar44 | (uint)!bVar25 * *(int *)(local_410.ray + 0x3f4);
              *(uint *)(local_410.ray + 0x3f8) =
                   (uint)bVar26 * iVar45 | (uint)!bVar26 * *(int *)(local_410.ray + 0x3f8);
              *(uint *)(local_410.ray + 0x3fc) =
                   (uint)bVar27 * iVar46 | (uint)!bVar27 * *(int *)(local_410.ray + 0x3fc);
              iVar32 = *(int *)(local_410.hit + 0x104);
              iVar33 = *(int *)(local_410.hit + 0x108);
              iVar34 = *(int *)(local_410.hit + 0x10c);
              iVar35 = *(int *)(local_410.hit + 0x110);
              iVar36 = *(int *)(local_410.hit + 0x114);
              iVar37 = *(int *)(local_410.hit + 0x118);
              iVar38 = *(int *)(local_410.hit + 0x11c);
              iVar39 = *(int *)(local_410.hit + 0x120);
              iVar40 = *(int *)(local_410.hit + 0x124);
              iVar41 = *(int *)(local_410.hit + 0x128);
              iVar42 = *(int *)(local_410.hit + 300);
              iVar43 = *(int *)(local_410.hit + 0x130);
              iVar44 = *(int *)(local_410.hit + 0x134);
              iVar45 = *(int *)(local_410.hit + 0x138);
              iVar46 = *(int *)(local_410.hit + 0x13c);
              bVar13 = (bool)((byte)(uVar49 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar49 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar49 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar49 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar49 >> 7) & 1);
              bVar21 = (bool)((byte)(uVar49 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar49 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar49 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar49 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar49 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar49 >> 0xe) & 1);
              bVar27 = SUB81(uVar49 >> 0xf,0);
              *(uint *)(local_410.ray + 0x400) =
                   (uint)(bVar55 & 1) * *(int *)(local_410.hit + 0x100) |
                   (uint)!(bool)(bVar55 & 1) * *(int *)(local_410.ray + 0x400);
              *(uint *)(local_410.ray + 0x404) =
                   (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_410.ray + 0x404);
              *(uint *)(local_410.ray + 0x408) =
                   (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_410.ray + 0x408);
              *(uint *)(local_410.ray + 0x40c) =
                   (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_410.ray + 0x40c);
              *(uint *)(local_410.ray + 0x410) =
                   (uint)bVar16 * iVar35 | (uint)!bVar16 * *(int *)(local_410.ray + 0x410);
              *(uint *)(local_410.ray + 0x414) =
                   (uint)bVar17 * iVar36 | (uint)!bVar17 * *(int *)(local_410.ray + 0x414);
              *(uint *)(local_410.ray + 0x418) =
                   (uint)bVar18 * iVar37 | (uint)!bVar18 * *(int *)(local_410.ray + 0x418);
              *(uint *)(local_410.ray + 0x41c) =
                   (uint)bVar19 * iVar38 | (uint)!bVar19 * *(int *)(local_410.ray + 0x41c);
              *(uint *)(local_410.ray + 0x420) =
                   (uint)(bVar20 & 1) * iVar39 |
                   (uint)!(bool)(bVar20 & 1) * *(int *)(local_410.ray + 0x420);
              *(uint *)(local_410.ray + 0x424) =
                   (uint)bVar21 * iVar40 | (uint)!bVar21 * *(int *)(local_410.ray + 0x424);
              *(uint *)(local_410.ray + 0x428) =
                   (uint)bVar22 * iVar41 | (uint)!bVar22 * *(int *)(local_410.ray + 0x428);
              *(uint *)(local_410.ray + 0x42c) =
                   (uint)bVar23 * iVar42 | (uint)!bVar23 * *(int *)(local_410.ray + 0x42c);
              *(uint *)(local_410.ray + 0x430) =
                   (uint)bVar24 * iVar43 | (uint)!bVar24 * *(int *)(local_410.ray + 0x430);
              *(uint *)(local_410.ray + 0x434) =
                   (uint)bVar25 * iVar44 | (uint)!bVar25 * *(int *)(local_410.ray + 0x434);
              *(uint *)(local_410.ray + 0x438) =
                   (uint)bVar26 * iVar45 | (uint)!bVar26 * *(int *)(local_410.ray + 0x438);
              *(uint *)(local_410.ray + 0x43c) =
                   (uint)bVar27 * iVar46 | (uint)!bVar27 * *(int *)(local_410.ray + 0x43c);
              auVar91 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_410.hit + 0x140));
              auVar91 = vmovdqu32_avx512f(auVar91);
              *(undefined1 (*) [64])(local_410.ray + 0x440) = auVar91;
              auVar91 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_410.hit + 0x180));
              auVar91 = vmovdqu32_avx512f(auVar91);
              *(undefined1 (*) [64])(local_410.ray + 0x480) = auVar91;
              auVar91 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_410.hit + 0x1c0));
              auVar91 = vmovdqa32_avx512f(auVar91);
              *(undefined1 (*) [64])(local_410.ray + 0x4c0) = auVar91;
              auVar91 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_410.hit + 0x200));
              auVar91 = vmovdqa32_avx512f(auVar91);
              *(undefined1 (*) [64])(local_410.ray + 0x500) = auVar91;
              auVar91 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
            }
            uVar81 = auVar91._0_4_;
            auVar63._4_4_ = uVar81;
            auVar63._0_4_ = uVar81;
            auVar63._8_4_ = uVar81;
            auVar63._12_4_ = uVar81;
            uVar29 = vcmpps_avx512vl(auVar88._0_16_,auVar63,2);
            bVar55 = ~(byte)(1 << (uVar47 & 0x1f)) & (byte)uVar56 & (byte)uVar29;
          }
          uVar56 = (uint)bVar55;
          if (bVar55 == 0) {
            return;
          }
          auVar62 = vblendmps_avx512vl(auVar76._0_16_,auVar88._0_16_);
          auVar64._0_4_ =
               (uint)(bVar55 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar63._0_4_;
          bVar13 = (bool)(bVar55 >> 1 & 1);
          auVar64._4_4_ = (uint)bVar13 * auVar62._4_4_ | (uint)!bVar13 * auVar63._4_4_;
          bVar13 = (bool)(bVar55 >> 2 & 1);
          auVar64._8_4_ = (uint)bVar13 * auVar62._8_4_ | (uint)!bVar13 * auVar63._8_4_;
          auVar64._12_4_ =
               (uint)(bVar55 >> 3) * auVar62._12_4_ | (uint)!(bool)(bVar55 >> 3) * auVar63._12_4_;
          auVar62 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar62 = vminps_avx(auVar62,auVar64);
          auVar69 = vshufpd_avx(auVar62,auVar62,1);
          auVar62 = vminps_avx(auVar69,auVar62);
          uVar29 = vcmpps_avx512vl(auVar64,auVar62,0);
          bVar55 = (byte)uVar29 & bVar55;
          uVar48 = uVar56;
          if (bVar55 != 0) {
            uVar48 = (uint)bVar55;
          }
          uVar47 = 0;
          for (; auVar63 = auVar64, (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x80000000) {
            uVar47 = uVar47 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }